

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpegls.cpp
# Opt level: O2

vector<signed_char,_std::allocator<signed_char>_> *
charls::anon_unknown_79::create_quantize_lut_lossless
          (vector<signed_char,_std::allocator<signed_char>_> *__return_storage_ptr__,
          int32_t bit_count)

{
  pointer pcVar1;
  int32_t maximum_sample_value;
  int iVar2;
  char cVar3;
  long lVar4;
  jpegls_pc_parameters preset;
  allocator_type local_2d;
  jpegls_pc_parameters local_2c;
  
  maximum_sample_value = calculate_maximum_sample_value(bit_count);
  compute_default(&local_2c,maximum_sample_value,0);
  std::vector<signed_char,_std::allocator<signed_char>_>::vector
            (__return_storage_ptr__,(long)local_2c.maximum_sample_value * 2 + 2,&local_2d);
  for (lVar4 = 0;
      pcVar1 = (__return_storage_ptr__->
               super__Vector_base<signed_char,_std::allocator<signed_char>_>)._M_impl.
               super__Vector_impl_data._M_start,
      lVar4 != (long)(__return_storage_ptr__->
                     super__Vector_base<signed_char,_std::allocator<signed_char>_>)._M_impl.
                     super__Vector_impl_data._M_finish - (long)pcVar1; lVar4 = lVar4 + 1) {
    iVar2 = ~local_2c.maximum_sample_value + (int)lVar4;
    cVar3 = -4;
    if (iVar2 != -local_2c.threshold3 &&
        SBORROW4(iVar2,-local_2c.threshold3) == iVar2 + local_2c.threshold3 < 0) {
      cVar3 = -3;
      if (iVar2 != -local_2c.threshold2 &&
          SBORROW4(iVar2,-local_2c.threshold2) == iVar2 + local_2c.threshold2 < 0) {
        cVar3 = -2;
        if (iVar2 != -local_2c.threshold1 &&
            SBORROW4(iVar2,-local_2c.threshold1) == iVar2 + local_2c.threshold1 < 0) {
          if (iVar2 < 0) {
            cVar3 = -1;
          }
          else if (iVar2 == 0) {
            cVar3 = '\0';
          }
          else {
            cVar3 = '\x01';
            if ((local_2c.threshold1 <= iVar2) && (cVar3 = '\x02', local_2c.threshold2 <= iVar2)) {
              cVar3 = '\x04' - (iVar2 < local_2c.threshold3);
            }
          }
        }
      }
    }
    pcVar1[lVar4] = cVar3;
  }
  return __return_storage_ptr__;
}

Assistant:

vector<int8_t> create_quantize_lut_lossless(const int32_t bit_count)
{
    const jpegls_pc_parameters preset{compute_default(calculate_maximum_sample_value(bit_count), 0)};
    const int32_t range{preset.maximum_sample_value + 1};

    vector<int8_t> lut(static_cast<size_t>(range) * 2);
    for (size_t i{}; i != lut.size(); ++i)
    {
        lut[i] = quantize_gradient_org(preset, static_cast<int32_t>(i) - range);
    }

    return lut;
}